

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O1

TFileStream * FileStream_CreateFile(TCHAR *szFileName,DWORD dwStreamFlags)

{
  bool bVar1;
  TFileStream *pStream;
  
  if ((char)dwStreamFlags == '\0') {
    pStream = AllocateFileStream(szFileName,0x100,dwStreamFlags);
    if (pStream != (TFileStream *)0x0) {
      bVar1 = BaseFile_Create(pStream);
      if (bVar1) {
        pStream->StreamRead = pStream->BaseRead;
        pStream->StreamWrite = pStream->BaseWrite;
        pStream->StreamResize = pStream->BaseResize;
        pStream->StreamGetSize = pStream->BaseGetSize;
        pStream->StreamGetPos = pStream->BaseGetPos;
        pStream->StreamClose = pStream->BaseClose;
        return pStream;
      }
      free(pStream);
    }
  }
  else {
    SetLastError(0x5f);
  }
  return (TFileStream *)0x0;
}

Assistant:

TFileStream * FileStream_CreateFile(
    const TCHAR * szFileName,
    DWORD dwStreamFlags)
{
    TFileStream * pStream;

    // We only support creation of flat, local file
    if((dwStreamFlags & (STREAM_PROVIDERS_MASK)) != (STREAM_PROVIDER_FLAT | BASE_PROVIDER_FILE))
    {
        SetLastError(ERROR_NOT_SUPPORTED);
        return NULL;
    }

    // Allocate file stream structure for flat stream
    pStream = AllocateFileStream(szFileName, sizeof(TBlockStream), dwStreamFlags);
    if(pStream != NULL)
    {
        // Attempt to create the disk file
        if(BaseFile_Create(pStream))
        {
            // Fill the stream provider functions
            pStream->StreamRead    = pStream->BaseRead;
            pStream->StreamWrite   = pStream->BaseWrite;
            pStream->StreamResize  = pStream->BaseResize;
            pStream->StreamGetSize = pStream->BaseGetSize;
            pStream->StreamGetPos  = pStream->BaseGetPos;
            pStream->StreamClose   = pStream->BaseClose;
            return pStream;
        }

        // File create failed, delete the stream
        CASC_FREE(pStream);
        pStream = NULL;
    }

    // Return the stream
    return pStream;
}